

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.cpp
# Opt level: O2

Color * __thiscall
RayTracer::m_calcRefraction
          (Color *__return_storage_ptr__,RayTracer *this,Collision *coll,Material *material,
          double weight,int depth)

{
  Color *this_00;
  ulong uVar1;
  double dVar2;
  double __x;
  Color ret;
  Vector3 r;
  Color local_a8;
  Vector3 local_90;
  Color local_78;
  Color local_60;
  Color local_48;
  
  uVar1 = -(ulong)(coll->is_internal != 0.0);
  Vector3::refract(&local_90,&coll->ray_dir,&coll->n,
                   (double)(~uVar1 & (ulong)material->rindex |
                           (ulong)(1.0 / material->rindex) & uVar1));
  dVar2 = Vector3::mod2(&local_90);
  if (1e-06 <= dVar2) {
    m_rayTraceing(&local_a8,this,&coll->p,&local_90,weight * material->refr,depth + 1);
    if ((coll->is_internal != 0.0) || (NAN(coll->is_internal))) {
      Color::operator*(&local_78,&material->absorb_color,-coll->dist);
      Color::exp(&local_60,__x);
      this_00 = &local_48;
      operator*(&local_a8,&local_60);
      dVar2 = material->refr;
    }
    else {
      dVar2 = material->refr;
      this_00 = &local_a8;
    }
    Color::operator*(__return_storage_ptr__,this_00,dVar2);
  }
  else {
    __return_storage_ptr__->r = 0.0;
    __return_storage_ptr__->g = 0.0;
    __return_storage_ptr__->b = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Color RayTracer::m_calcRefraction(const Collision& coll, const Material* material, double weight, int depth) const
{
    double rindex = material->rindex;
    if (coll.is_internal) rindex = 1 / rindex;
    Vector3 r = coll.ray_dir.refract(coll.n, rindex);
    if (r.mod2() < Const::EPS) return Color();

    Color ret = m_rayTraceing(coll.p, r, weight * material->refr, depth + 1);
    if (!coll.is_internal)
        return ret * material->refr;
    else
        return ret * (material->absorb_color * -coll.dist).exp() * material->refr;
}